

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

bool google::protobuf::internal::SplitFieldHasExtraIndirection(FieldDescriptor *field)

{
  byte bVar1;
  Nonnull<const_char_*> pcVar2;
  bool v1;
  
  bVar1 = field->field_0x1;
  v1 = (bool)((bVar1 & 0x20) >> 5);
  if (0xbf < bVar1 == v1) {
    pcVar2 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                       (v1,0xbf < bVar1,
                        "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
  }
  if (pcVar2 == (Nonnull<const_char_*>)0x0) {
    return (bool)((field->field_0x1 & 0x20) >> 5);
  }
  SplitFieldHasExtraIndirection();
}

Assistant:

bool SplitFieldHasExtraIndirection(const FieldDescriptor* field) {
  return field->is_repeated();
}